

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall CLI::Validator::Validator(Validator *this,string *validator_desc)

{
  anon_class_1_0_00000001 local_45 [13];
  string local_38 [32];
  string *local_18;
  string *validator_desc_local;
  Validator *this_local;
  
  local_18 = validator_desc;
  validator_desc_local = (string *)this;
  ::std::__cxx11::string::string(local_38,validator_desc);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::Validator(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)this,(anon_class_32_1_5ff8519c *)local_38);
  Validator(std::__cxx11::string)::{lambda()#1}::~basic_string((_lambda___1_ *)local_38);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::Validator::func_::_lambda(std::__cxx11::string&)_1_,void>
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&this->func_,local_45);
  ::std::__cxx11::string::string((string *)&this->name_);
  this->application_index_ = -1;
  this->active_ = true;
  this->non_modifying_ = false;
  return;
}

Assistant:

explicit Validator(std::string validator_desc) : desc_function_([validator_desc]() { return validator_desc; }) {}